

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall
cmCTestSVN::GuessBase
          (cmCTestSVN *this,SVNInfo *svninfo,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  bool bVar1;
  uint uVar2;
  pointer pCVar3;
  ostream *poVar4;
  bool local_a1;
  __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
  local_88;
  __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
  local_80;
  const_iterator ci;
  string local_68;
  undefined1 local_48 [8];
  string base;
  size_type slash;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes_local;
  SVNInfo *svninfo_local;
  cmCTestSVN *this_local;
  
  base.field_2._8_8_ = std::__cxx11::string::find((char)svninfo + ' ',0x2f);
  while (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0 && base.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)&svninfo->URL);
    cmCTest::DecodeURL((string *)local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    local_80._M_current =
         (Change *)
         std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::begin
                   (changes);
    while( true ) {
      uVar2 = std::__cxx11::string::empty();
      local_a1 = false;
      if ((uVar2 & 1) != 0) {
        local_88._M_current =
             (Change *)
             std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::end
                       (changes);
        local_a1 = __gnu_cxx::operator!=(&local_80,&local_88);
      }
      if (local_a1 == false) break;
      pCVar3 = __gnu_cxx::
               __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
               ::operator->(&local_80);
      bVar1 = cmCTestSVNPathStarts(&pCVar3->Path,(string *)local_48);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&svninfo->Base,(string *)local_48);
      }
      __gnu_cxx::
      __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
      ::operator++(&local_80);
    }
    std::__cxx11::string::~string((string *)local_48);
    base.field_2._8_8_ = std::__cxx11::string::find((char)svninfo + ' ',0x2f);
  }
  std::__cxx11::string::operator+=((string *)&svninfo->Base,"/");
  poVar4 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Guessed Base = ");
  poVar4 = std::operator<<(poVar4,(string *)&svninfo->Base);
  std::operator<<(poVar4,"\n");
  return;
}

Assistant:

void cmCTestSVN::GuessBase(SVNInfo& svninfo,
                           std::vector<Change> const& changes)
{
  // Subversion did not give us a good repository root so we need to
  // guess the base path from the URL and the paths in a revision with
  // changes under it.

  // Consider each possible URL suffix from longest to shortest.
  for (std::string::size_type slash = svninfo.URL.find('/');
       svninfo.Base.empty() && slash != std::string::npos;
       slash = svninfo.URL.find('/', slash + 1)) {
    // If the URL suffix is a prefix of at least one path then it is the base.
    std::string base = cmCTest::DecodeURL(svninfo.URL.substr(slash));
    for (auto ci = changes.begin();
         svninfo.Base.empty() && ci != changes.end(); ++ci) {
      if (cmCTestSVNPathStarts(ci->Path, base)) {
        svninfo.Base = base;
      }
    }
  }

  // We always append a slash so that we know paths beginning in the
  // base lie under its path.  If no base was found then the working
  // tree must be a checkout of the entire repo and this will match
  // the leading slash in all paths.
  svninfo.Base += "/";

  this->Log << "Guessed Base = " << svninfo.Base << "\n";
}